

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

bool __thiscall google::protobuf::internal::ExtensionSet::Has(ExtensionSet *this,int number)

{
  byte bVar1;
  Extension *pEVar2;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    bVar1 = 0;
  }
  else {
    if (pEVar2->is_repeated == true) {
      LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0xf6);
      other = LogMessage::operator<<(&local_48,"CHECK failed: !ext->is_repeated: ");
      LogFinisher::operator=(&local_49,other);
      LogMessage::~LogMessage(&local_48);
    }
    bVar1 = pEVar2->field_0xa ^ 1;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool ExtensionSet::Has(int number) const {
  const Extension* ext = FindOrNull(number);
  if (ext == nullptr) return false;
  GOOGLE_DCHECK(!ext->is_repeated);
  return !ext->is_cleared;
}